

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

void __thiscall slang::ast::DeclaredType::checkType(DeclaredType *this,ASTContext *context)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (this->flags).m_bits & 0x16fc0;
  iVar1 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
    }
  }
  (*(code *)(&DAT_008f43d0 + *(int *)(&DAT_008f43d0 + (ulong)(iVar1 - 6) * 4)))();
  return;
}

Assistant:

void DeclaredType::checkType(const ASTContext& context) const {
    auto lv = context.getCompilation().languageVersion();
    uint32_t masked = (flags & DeclaredTypeFlags::NeedsTypeCheck).bits();
    SLANG_ASSERT(std::popcount(masked) == 1);

    switch (masked) {
        case uint32_t(DeclaredTypeFlags::NetType): {
            auto& net = parent.as<NetSymbol>();
            if (net.netType.netKind != NetType::UserDefined && !isValidForNet(*type))
                context.addDiag(diag::InvalidNetType, parent.location) << *type;
            else if (type->getBitWidth() == 1 && net.expansionHint != NetSymbol::None)
                context.addDiag(diag::SingleBitVectored, parent.location);
            break;
        }
        case uint32_t(DeclaredTypeFlags::UserDefinedNetType):
            if (!isValidForUserDefinedNet(*type))
                context.addDiag(diag::InvalidUserDefinedNetType, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::FormalArgMergeVar):
            if (auto var = parent.as<FormalArgumentSymbol>().getMergedVariable()) {
                SLANG_ASSERT(!hasLink);
                SLANG_ASSERT(typeOrLink.typeSyntax);
                mergePortTypes(context, *var, typeOrLink.typeSyntax->as<ImplicitTypeSyntax>(),
                               parent.location,
                               dimensions ? *dimensions
                                          : std::span<const VariableDimensionSyntax* const>{});
            }
            break;
        case uint32_t(DeclaredTypeFlags::Rand): {
            RandMode mode = parent.getRandMode();
            if (!type->isValidForRand(mode, lv)) {
                auto& diag = context.addDiag(diag::InvalidRandType, parent.location) << *type;
                if (mode == RandMode::Rand)
                    diag << "rand"sv;
                else
                    diag << "randc"sv;
            }
            break;
        }
        case uint32_t(DeclaredTypeFlags::DPIReturnType): {
            if (!type->isValidForDPIReturn())
                context.addDiag(diag::InvalidDPIReturnType, parent.location) << *type;
            else if (parent.as<SubroutineSymbol>().flags.has(MethodFlags::Pure) && type->isVoid())
                context.addDiag(diag::DPIPureReturn, parent.location);
            break;
        }
        case uint32_t(DeclaredTypeFlags::DPIArg):
            if (!type->isValidForDPIArg())
                context.addDiag(diag::InvalidDPIArgType, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::RequireSequenceType):
            if (!type->isValidForSequence())
                context.addDiag(diag::AssertionExprType, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::CoverageType):
            if (!type->isIntegral() && (lv < LanguageVersion::v1800_2023 || !type->isFloating()))
                context.addDiag(diag::InvalidCoverageExpr, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::InterfaceVariable):
            if (!isValidForIfaceVar(*type))
                context.addDiag(diag::VirtualInterfaceIfaceMember, parent.location);
            break;
        default:
            SLANG_UNREACHABLE;
    }
}